

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_rawlen(lua_State *L)

{
  TValue *pTVar1;
  TValue *pTVar2;
  MSize MVar3;
  
  pTVar1 = L->base;
  pTVar2 = L->top;
  if (pTVar1 < pTVar2) {
    if ((pTVar1->field_2).it == 0xfffffffb) {
      MVar3 = *(MSize *)((ulong)(pTVar1->u32).lo + 0xc);
    }
    else {
      if ((pTVar1->field_2).it != 0xfffffff4) goto LAB_00141ac0;
      MVar3 = lj_tab_len((GCtab *)(ulong)(pTVar1->u32).lo);
    }
    pTVar2[-1].n = (double)(int)MVar3;
    return 1;
  }
LAB_00141ac0:
  lj_err_argt(L,1,5);
}

Assistant:

LJLIB_CF(rawlen)		LJLIB_REC(.)
{
  cTValue *o = L->base;
  int32_t len;
  if (L->top > o && tvisstr(o))
    len = (int32_t)strV(o)->len;
  else
    len = (int32_t)lj_tab_len(lj_lib_checktab(L, 1));
  setintV(L->top-1, len);
  return 1;
}